

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn5.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,yarn5 *R)

{
  undefined4 uVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  poVar2 = std::operator<<(out,'[');
  pcVar3 = yarn5::name();
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,' ');
  pbVar4 = operator<<(poVar2,&R->P);
  poVar2 = std::operator<<(pbVar4,' ');
  pbVar4 = operator<<(poVar2,&R->S);
  std::operator<<(pbVar4,']');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
        std::basic_ostream<char_t, traits_t> &out, const yarn5 &R) {
      std::ios_base::fmtflags flags(out.flags());
      out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      out << '[' << yarn5::name() << ' ' << R.P << ' ' << R.S << ']';
      out.flags(flags);
      return out;
    }